

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitDrop(PrintExpressionContents *this,Drop *curr)

{
  ulong uVar1;
  ostream *poVar2;
  string_view str;
  string_view str_00;
  
  uVar1 = (curr->value->type).id;
  if ((uVar1 & 1) != 0 && 6 < uVar1) {
    str._M_str = "tuple.drop ";
    str._M_len = 0xb;
    printMedium(this->o,str);
    poVar2 = this->o;
    wasm::Type::size(&curr->value->type);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    return;
  }
  str_00._M_str = "drop";
  str_00._M_len = 4;
  printMedium(this->o,str_00);
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    if (curr->value->type.isTuple()) {
      printMedium(o, "tuple.drop ");
      o << curr->value->type.size();
    } else {
      printMedium(o, "drop");
    }
  }